

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ReadListFile(cmMakefile *this,cmListFile *listFile,string *filenametoread)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  cmExecutionStatus status;
  allocator local_99;
  string local_98;
  LexicalPushPop lexScope;
  string currentFile;
  string currentParentFile;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::__cxx11::string::string((string *)&currentFile,"CMAKE_PARENT_LIST_FILE",(allocator *)&status)
  ;
  pcVar2 = GetSafeDefinition(this,&currentFile);
  std::__cxx11::string::string((string *)&currentParentFile,pcVar2,(allocator *)&local_98);
  std::__cxx11::string::~string((string *)&currentFile);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_98);
  pcVar2 = GetSafeDefinition(this,(string *)&status);
  std::__cxx11::string::string((string *)&currentFile,pcVar2,(allocator *)&lexScope);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_98);
  AddDefinition(this,(string *)&status,(filenametoread->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator *)&lexScope);
  cmsys::SystemTools::GetFilenamePath(&local_98,filenametoread);
  AddDefinition(this,(string *)&status,local_98._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_98);
  MarkVariableAsUsed(this,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_98);
  MarkVariableAsUsed(this,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator *)&local_98);
  MarkVariableAsUsed(this,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  lexScope.ReportError = true;
  lexScope.Makefile = this;
  PushFunctionBlockerBarrier(this);
  lVar4 = ((long)(listFile->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish -
          (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x60 + 1;
  lVar3 = 0;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) break;
    status.ReturnInvoked = false;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    ExecuteCommand(this,(cmListFileFunction *)
                        ((long)&(((listFile->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_cmListFileContext).Name + lVar3),&status);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      lexScope.ReportError = false;
      break;
    }
    lVar3 = lVar3 + 0x60;
  } while (status.ReturnInvoked != true);
  CheckForUnusedVariables(this);
  std::__cxx11::string::string((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_98);
  AddDefinition(this,(string *)&status,currentParentFile._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_98);
  AddDefinition(this,(string *)&status,currentFile._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_DIR",&local_99);
  cmsys::SystemTools::GetFilenamePath(&local_98,&currentFile);
  AddDefinition(this,(string *)&status,local_98._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_98);
  MarkVariableAsUsed(this,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_98);
  MarkVariableAsUsed(this,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::string((string *)&status,"CMAKE_CURRENT_LIST_DIR",(allocator *)&local_98);
  MarkVariableAsUsed(this,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  LexicalPushPop::~LexicalPushPop(&lexScope);
  std::__cxx11::string::~string((string *)&currentFile);
  std::__cxx11::string::~string((string *)&currentParentFile);
  return;
}

Assistant:

void cmMakefile::ReadListFile(cmListFile const& listFile,
                              std::string const& filenametoread)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile
      = this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile
    = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                       cmSystemTools::GetFilenamePath(filenametoread).c_str());

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Enforce balanced blocks (if/endif, function/endfunction, etc.).
  LexicalPushPop lexScope(this);

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for(size_t i =0; i < numberFunctions; ++i)
    {
    cmExecutionStatus status;
    this->ExecuteCommand(listFile.Functions[i],status);
    if(cmSystemTools::GetFatalErrorOccured())
      {
      // Exit early due to error.
      lexScope.Quiet();
      break;
      }
    if(status.GetReturnInvoked())
      {
      // Exit early due to return command.
      break;
      }
    }
  this->CheckForUnusedVariables();

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile).c_str());
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}